

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packages.cpp
# Opt level: O1

bool IsConsistentPackage(Package *txns)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pCVar3;
  iterator iVar4;
  CTxIn *input;
  pointer pCVar5;
  shared_ptr<const_CTransaction> *tx;
  pointer psVar6;
  long in_FS_OFFSET;
  bool bVar7;
  unordered_set<COutPoint,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<COutPoint>_>
  inputs_seen;
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_b8;
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint32_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SaltedOutpointHasher::SaltedOutpointHasher((SaltedOutpointHasher *)&local_b8,false);
  local_b8._M_buckets = &local_b8._M_single_bucket;
  local_b8._M_bucket_count = 1;
  local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_element_count = 0;
  local_b8._M_rehash_policy._M_max_load_factor = 1.0;
  local_b8._M_rehash_policy._M_next_resize = 0;
  local_b8._M_single_bucket = (__node_base_ptr)0x0;
  psVar6 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (txns->
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = psVar6 == psVar1;
  if (!bVar7) {
    while( true ) {
      peVar2 = (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar5 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar3 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar5 == pCVar3) break;
      do {
        iVar4 = std::
                _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find(&local_b8,&pCVar5->prevout);
        if (iVar4.super__Node_iterator_base<COutPoint,_false>._M_cur != (__node_type *)0x0)
        goto LAB_0028470f;
        pCVar5 = pCVar5 + 1;
      } while (pCVar5 != pCVar3);
      peVar2 = (psVar6->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pCVar3 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pCVar5 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start; pCVar5 != pCVar3; pCVar5 = pCVar5 + 1) {
        local_48 = (pCVar5->prevout).n;
        local_68 = *(undefined4 *)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data;
        uStack_64 = *(undefined4 *)
                     ((long)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 4);
        uStack_60 = *(undefined4 *)
                     ((long)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 8);
        uStack_5c = *(undefined4 *)
                     ((long)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0xc);
        local_58 = *(undefined4 *)
                    ((long)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x10);
        uStack_54 = *(undefined4 *)
                     ((long)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x14);
        uStack_50 = *(undefined4 *)
                     ((long)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x18);
        uStack_4c = *(undefined4 *)
                     ((long)&(pCVar5->prevout).hash.m_wrapped.super_base_blob<256U>.m_data + 0x1c);
        local_70 = &local_b8;
        std::
        _Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<COutPoint,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<COutPoint,false>>>>
                  ((_Hashtable<COutPoint,COutPoint,std::allocator<COutPoint>,std::__detail::_Identity,std::equal_to<COutPoint>,SaltedOutpointHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&local_b8,&local_68,&local_70);
      }
      psVar6 = psVar6 + 1;
      bVar7 = psVar6 == psVar1;
      if (bVar7) break;
    }
  }
LAB_0028470f:
  std::
  _Hashtable<COutPoint,_COutPoint,_std::allocator<COutPoint>,_std::__detail::_Identity,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool IsConsistentPackage(const Package& txns)
{
    // Don't allow any conflicting transactions, i.e. spending the same inputs, in a package.
    std::unordered_set<COutPoint, SaltedOutpointHasher> inputs_seen;
    for (const auto& tx : txns) {
        if (tx->vin.empty()) {
            // This function checks consistency based on inputs, and we can't do that if there are
            // no inputs. Duplicate empty transactions are also not consistent with one another.
            // This doesn't create false negatives, as unconfirmed transactions are not allowed to
            // have no inputs.
            return false;
        }
        for (const auto& input : tx->vin) {
            if (inputs_seen.find(input.prevout) != inputs_seen.end()) {
                // This input is also present in another tx in the package.
                return false;
            }
        }
        // Batch-add all the inputs for a tx at a time. If we added them 1 at a time, we could
        // catch duplicate inputs within a single tx.  This is a more severe, consensus error,
        // and we want to report that from CheckTransaction instead.
        std::transform(tx->vin.cbegin(), tx->vin.cend(), std::inserter(inputs_seen, inputs_seen.end()),
                       [](const auto& input) { return input.prevout; });
    }
    return true;
}